

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int KINSetJacTimesVecFn(void *kinmem,KINLsJacTimesVecFn jtv)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetJacTimesVecFn",&kin_mem,&kinls_mem);
  if (iVar1 == 0) {
    if (kinls_mem->LS->ops->setatimes ==
        (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
      iVar1 = -3;
      KINProcessError(kin_mem,-3,0x148,"KINSetJacTimesVecFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied ATimes routine");
    }
    else {
      if (jtv == (KINLsJacTimesVecFn)0x0) {
        kinls_mem->jtimesDQ = 1;
        kinls_mem->jtimes = kinLsDQJtimes;
        kinls_mem->jt_func = kin_mem->kin_func;
      }
      else {
        kinls_mem->jtimesDQ = 0;
        kinls_mem->jtimes = jtv;
        kin_mem = (KINMem)kin_mem->kin_user_data;
      }
      kinls_mem->jt_data = kin_mem;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int KINSetJacTimesVecFn(void* kinmem, KINLsJacTimesVecFn jtv)
{
  int retval;
  KINMem kin_mem;
  KINLsMem kinls_mem;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* issue error if LS object does not support user-supplied ATimes */
  if (kinls_mem->LS->ops->setatimes == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "ATimes routine");
    return (KINLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routine in KINLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtv != NULL)
  {
    kinls_mem->jtimesDQ = SUNFALSE;
    kinls_mem->jtimes   = jtv;
    kinls_mem->jt_data  = kin_mem->kin_user_data;
  }
  else
  {
    kinls_mem->jtimesDQ = SUNTRUE;
    kinls_mem->jtimes   = kinLsDQJtimes;
    kinls_mem->jt_func  = kin_mem->kin_func;
    kinls_mem->jt_data  = kin_mem;
  }

  return (KINLS_SUCCESS);
}